

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
Util::toString_abi_cxx11_(string *__return_storage_ptr__,Util *this,ImageScaleType scaleType)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "ScaleCenter";
    paVar1 = &local_a;
    break;
  case 1:
    pcVar2 = "ScaleStretch";
    paVar1 = &local_d;
    break;
  case 2:
    pcVar2 = "ScaleAspectInside";
    paVar1 = &local_9;
    break;
  case 3:
    pcVar2 = "ScaleAspectOutside";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "ScaleNinePatch";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "UNSUPPORTED";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Util::toString(ImageScaleType scaleType)
{
	switch (scaleType)
	{
	case ScaleAspectInside:
		return "ScaleAspectInside";
	case ScaleCenter:
		return "ScaleCenter";
	case ScaleAspectOutside:
		return "ScaleAspectOutside";
	case ScaleNinePatch:
		return "ScaleNinePatch";
	case ScaleStretch:
		return "ScaleStretch";
	default:
		return "UNSUPPORTED";
	}
}